

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O0

InfoStatus
getLocalInfoType(HighsLogOptions *report_log_options,string *name,
                vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *info_records,
                HighsInfoType *type)

{
  const_reference ppIVar1;
  vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *in_RCX;
  string *in_RDX;
  HighsLogOptions *in_RSI;
  InfoStatus status;
  HighsInt index;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  InfoStatus local_4;
  
  local_4 = getInfoIndex(in_RSI,in_RDX,in_RCX,
                         (HighsInt *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (local_4 == kOk) {
    ppIVar1 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                        ((vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *)in_RDX,
                         (long)in_stack_ffffffffffffffd4);
    *(HighsInfoType *)
     &(in_RCX->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>)._M_impl.
      super__Vector_impl_data._M_start = (*ppIVar1)->type;
    local_4 = kOk;
  }
  return local_4;
}

Assistant:

InfoStatus getLocalInfoType(const HighsLogOptions& report_log_options,
                            const std::string& name,
                            const std::vector<InfoRecord*>& info_records,
                            HighsInfoType& type) {
  HighsInt index;
  InfoStatus status =
      getInfoIndex(report_log_options, name, info_records, index);
  if (status != InfoStatus::kOk) return status;
  type = info_records[index]->type;
  return InfoStatus::kOk;
}